

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O1

int argon2_ctx_mem(argon2_context *context,argon2_type type,void *memory,size_t memory_size)

{
  int iVar1;
  argon2_instance_t instance;
  argon2_instance_t local_58;
  
  iVar1 = validate_inputs(context);
  if ((iVar1 == 0) && (iVar1 = -0x1a, type < (Argon2_id|Argon2_i))) {
    local_58.lanes = context->lanes;
    local_58.segment_length = context->m_cost;
    if (context->m_cost < local_58.lanes * 8) {
      local_58.segment_length = local_58.lanes * 8;
    }
    local_58.segment_length = local_58.segment_length / (local_58.lanes * 4);
    local_58.memory_blocks = local_58.lanes * 4 * local_58.segment_length;
    if ((memory == (void *)0x0) ||
       ((iVar1 = -0x16, (memory_size & 0x3ff) == 0 &&
        ((ulong)local_58.memory_blocks <= memory_size >> 10)))) {
      local_58.keep_memory = (int)(memory != (void *)0x0);
      local_58.version = context->version;
      local_58.passes = context->t_cost;
      local_58.lane_length = local_58.segment_length << 2;
      local_58.threads = context->threads;
      local_58.print_internals = context->flags >> 3 & 1;
      if (local_58.lanes < local_58.threads) {
        local_58.threads = local_58.lanes;
      }
      local_58.memory = (block *)memory;
      local_58.type = type;
      iVar1 = initialize(&local_58,context);
      if (iVar1 == 0) {
        iVar1 = fill_memory_blocks(&local_58);
        if (iVar1 == 0) {
          finalize(context,&local_58);
          iVar1 = 0;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int argon2_ctx_mem(argon2_context *context, argon2_type type, void *memory,
                   size_t memory_size) {
    /* 1. Validate all inputs */
    int result = validate_inputs(context);
    uint32_t memory_blocks, segment_length;
    argon2_instance_t instance;

    if (ARGON2_OK != result) {
        return result;
    }

    if (Argon2_d != type && Argon2_i != type && Argon2_id != type) {
        return ARGON2_INCORRECT_TYPE;
    }

    /* 2. Align memory size */
    argon2_compute_memory_blocks(&memory_blocks, &segment_length,
                                 context->m_cost, context->lanes);

    /* check for sufficient memory size: */
    if (memory != NULL && (memory_size % ARGON2_BLOCK_SIZE != 0 ||
                           memory_size / ARGON2_BLOCK_SIZE < memory_blocks)) {
        return ARGON2_MEMORY_ALLOCATION_ERROR;
    }

    instance.version = context->version;
    instance.memory = (block *)memory;
    instance.passes = context->t_cost;
    instance.memory_blocks = memory_blocks;
    instance.segment_length = segment_length;
    instance.lane_length = segment_length * ARGON2_SYNC_POINTS;
    instance.lanes = context->lanes;
    instance.threads = context->threads;
    instance.type = type;
    instance.print_internals = !!(context->flags & ARGON2_FLAG_GENKAT);
    instance.keep_memory = memory != NULL;

    if (instance.threads > instance.lanes) {
        instance.threads = instance.lanes;
    }

    /* 3. Initialization: Hashing inputs, allocating memory, filling first
     * blocks
     */
    result = initialize(&instance, context);

    if (ARGON2_OK != result) {
        return result;
    }

    /* 4. Filling memory */
    result = fill_memory_blocks(&instance);

    if (ARGON2_OK != result) {
        return result;
    }
    /* 5. Finalization */
    finalize(context, &instance);

    return ARGON2_OK;
}